

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::EnumFieldGenerator::GenerateInlineAccessorDefinitions
          (EnumFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "inline $type$ $classname$::$name$() const {\n  return static_cast< $type$ >($name$_);\n}\ninline void $classname$::set_$name$($type$ value) {\n  assert($type$_IsValid(value));\n  set_has_$name$();\n  $name$_ = value;\n}\n"
                    );
  return;
}

Assistant:

void EnumFieldGenerator::
GenerateInlineAccessorDefinitions(io::Printer* printer) const {
  printer->Print(variables_,
    "inline $type$ $classname$::$name$() const {\n"
    "  return static_cast< $type$ >($name$_);\n"
    "}\n"
    "inline void $classname$::set_$name$($type$ value) {\n"
    "  assert($type$_IsValid(value));\n"
    "  set_has_$name$();\n"
    "  $name$_ = value;\n"
    "}\n");
}